

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreClient.cpp
# Opt level: O3

Enum __thiscall
ViconDataStreamSDK::Core::VClient::GetVideoFrame
          (VClient *this,string *i_rCameraName,VVideoFramePtr *o_rVideoFramePtr)

{
  Enum EVar1;
  bool bVar2;
  VCameraInfo *pVVar3;
  Enum GetResult;
  scoped_lock Lock;
  Enum local_2c;
  unique_lock<boost::recursive_mutex> local_28;
  
  local_28.m = &this->m_FrameMutex;
  local_28.is_locked = false;
  boost::unique_lock<boost::recursive_mutex>::lock(&local_28);
  local_2c = Success;
  bVar2 = InitGet(this,&local_2c);
  if (bVar2) {
    pVVar3 = GetCamera(this,i_rCameraName,&local_2c);
    if (pVVar3 != (VCameraInfo *)0x0) {
      GetVideoFrame(this,pVVar3->m_CameraID,&local_2c,o_rVideoFramePtr);
    }
  }
  EVar1 = local_2c;
  if (local_28.is_locked == true) {
    boost::recursive_mutex::unlock(local_28.m);
  }
  return EVar1;
}

Assistant:

Result::Enum VClient::GetVideoFrame( const std::string & i_rCameraName, ViconCGStreamClientSDK::VVideoFramePtr & o_rVideoFramePtr ) const
{
  boost::recursive_mutex::scoped_lock Lock( m_FrameMutex );

  Result::Enum GetResult = Result::Success;
  if ( InitGet( GetResult ) )
  {
    const ViconCGStream::VCameraInfo* pCamera = GetCamera( i_rCameraName, GetResult );
    if( !pCamera )
    {
      return GetResult;
    }

    GetVideoFrame( pCamera->m_CameraID, GetResult, o_rVideoFramePtr );
  }

  return GetResult;
}